

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jzon.hpp
# Opt level: O2

void __thiscall Jzon::Node::set(Node *this,string *value)

{
  string local_40;
  
  if ((this->data != (Data *)0x0) && (this->data->type - T_NULL < 4)) {
    detach(this);
    this->data->type = T_STRING;
    unescapeString(&local_40,value);
    std::__cxx11::string::operator=((string *)&this->data->valueStr,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

inline bool isObject() const { return (getType() == T_OBJECT);  }